

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O0

bool anon_unknown.dwarf_157a4::equal<float>(float x,float y)

{
  float fVar1;
  float local_18;
  float r;
  float y_local;
  float x_local;
  
  local_18 = x - y;
  if (local_18 < 0.0) {
    local_18 = y - x;
  }
  fVar1 = epsilon<float>();
  return local_18 < fVar1;
}

Assistant:

bool equal(float x, float y)
    {
        float r = x-y;
        if (r < 0)
            r = y-x;
        if (r < epsilon<float>())
            return true;
        return false;
    }